

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_ipc_messages.cpp
# Opt level: O2

int test_ipcmsg_resultsummary(ITesting *t)

{
  bool bVar1;
  kTRContinueMode kVar2;
  int iVar3;
  IPCResultSummary local_120;
  UTest_IPC_VectorWriter vectorWriter;
  IPCResultSummary resultSummaryIn;
  IPCBufferedWriter bufferedWriter;
  IPCBinaryDecoder decoder;
  IPCBinaryEncoder encoder;
  UTest_IPC_VectorReader vectorReader;
  
  local_120.super_IPCSerializer._vptr_IPCSerializer = (_func_int **)&PTR__IPCResultSummary_0023d120;
  local_120.super_IPCDeserializer.super_IPCObject._vptr_IPCObject =
       (IPCObject)&PTR__IPCResultSummary_0023d158;
  local_120.testResults.
  super__Vector_base<gnilk::IPCTestResults_*,_std::allocator<gnilk::IPCTestResults_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_120.testResults.
  super__Vector_base<gnilk::IPCTestResults_*,_std::allocator<gnilk::IPCTestResults_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_120.testResults.
  super__Vector_base<gnilk::IPCTestResults_*,_std::allocator<gnilk::IPCTestResults_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_120.testsExecuted = 1;
  local_120.testsFailed = 2;
  local_120.durationSec = 3.0;
  vectorWriter.super_IPCWriter._vptr_IPCWriter = (_func_int **)&PTR_Write_0023c8d8;
  vectorWriter.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  vectorWriter.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  vectorWriter.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  gnilk::IPCBufferedWriter::IPCBufferedWriter(&bufferedWriter,&vectorWriter.super_IPCWriter);
  encoder._0_8_ = &PTR_Write_0023cef8;
  encoder.writer = &bufferedWriter.super_IPCWriter;
  bVar1 = gnilk::IPCResultSummary::Marshal(&local_120,&encoder.super_IPCEncoderBase);
  iVar3 = 0x10;
  if (!bVar1) {
    kVar2 = (*t->AssertError)(0x23,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/src/testrunner/ipc/tests/test_ipc_messages.cpp"
                              ,"resultSummaryOut.Marshal(encoder)");
    if (kVar2 == kTRLeave) goto LAB_0018191a;
  }
  gnilk::IPCBufferedWriter::Flush(&bufferedWriter);
  if (vectorWriter.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start ==
      vectorWriter.data.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish) {
    kVar2 = (*t->AssertError)(0x27,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/src/testrunner/ipc/tests/test_ipc_messages.cpp"
                              ,"!vectorWriter.Data().empty()");
    if (kVar2 == kTRLeave) goto LAB_0018191a;
  }
  vectorReader.data = &vectorWriter.data;
  decoder.reader = &vectorReader.super_IPCReader;
  vectorReader.super_IPCReader._vptr_IPCReader = (_func_int **)&PTR_Read_0023c928;
  vectorReader.idx = 0;
  decoder.deserializer = &resultSummaryIn.super_IPCDeserializer;
  resultSummaryIn.super_IPCSerializer._vptr_IPCSerializer =
       (_func_int **)&PTR__IPCResultSummary_0023d120;
  resultSummaryIn.super_IPCDeserializer.super_IPCObject._vptr_IPCObject =
       (IPCObject)&PTR__IPCResultSummary_0023d158;
  resultSummaryIn.testResults.
  super__Vector_base<gnilk::IPCTestResults_*,_std::allocator<gnilk::IPCTestResults_*>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  resultSummaryIn.testsExecuted = 0;
  resultSummaryIn.testsFailed = 0;
  resultSummaryIn.durationSec = 0.0;
  resultSummaryIn.testResults.
  super__Vector_base<gnilk::IPCTestResults_*,_std::allocator<gnilk::IPCTestResults_*>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  resultSummaryIn.testResults.
  super__Vector_base<gnilk::IPCTestResults_*,_std::allocator<gnilk::IPCTestResults_*>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  decoder.super_IPCDecoderBase.super_IPCReader._vptr_IPCReader = (IPCReader)&PTR_Read_0023ce28;
  bVar1 = gnilk::IPCBinaryDecoder::Process(&decoder);
  if (bVar1) {
LAB_00181873:
    iVar3 = (*(decoder.reader)->_vptr_IPCReader[1])();
    if ((char)iVar3 != '\0') {
      kVar2 = (*t->AssertError)(0x30,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/src/testrunner/ipc/tests/test_ipc_messages.cpp"
                                ,"decoder.Available() == false");
      if (kVar2 == kTRLeave) goto LAB_0018190d;
    }
    if (resultSummaryIn.testsExecuted != local_120.testsExecuted) {
      kVar2 = (*t->AssertError)(0x33,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/src/testrunner/ipc/tests/test_ipc_messages.cpp"
                                ,"resultSummaryIn.testsExecuted == resultSummaryOut.testsExecuted");
      if (kVar2 == kTRLeave) goto LAB_0018190d;
    }
    if (resultSummaryIn.testsFailed != local_120.testsFailed) {
      kVar2 = (*t->AssertError)(0x34,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/src/testrunner/ipc/tests/test_ipc_messages.cpp"
                                ,"resultSummaryIn.testsFailed == resultSummaryOut.testsFailed");
      if (kVar2 == kTRLeave) goto LAB_0018190d;
    }
    if ((resultSummaryIn.durationSec != local_120.durationSec) ||
       (NAN(resultSummaryIn.durationSec) || NAN(local_120.durationSec))) {
      kVar2 = (*t->AssertError)(0x35,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/src/testrunner/ipc/tests/test_ipc_messages.cpp"
                                ,"resultSummaryIn.durationSec == resultSummaryOut.durationSec");
      if (kVar2 == kTRLeave) goto LAB_0018190d;
    }
    iVar3 = 0;
  }
  else {
    kVar2 = (*t->AssertError)(0x2f,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/gnilk[P]testrunner/src/testrunner/ipc/tests/test_ipc_messages.cpp"
                              ,"decoder.Process()");
    if (kVar2 != kTRLeave) goto LAB_00181873;
LAB_0018190d:
    iVar3 = 0x10;
  }
  gnilk::IPCResultSummary::~IPCResultSummary(&resultSummaryIn);
LAB_0018191a:
  gnilk::IPCBufferedWriter::~IPCBufferedWriter(&bufferedWriter);
  UTest_IPC_VectorWriter::~UTest_IPC_VectorWriter(&vectorWriter);
  gnilk::IPCResultSummary::~IPCResultSummary(&local_120);
  return iVar3;
}

Assistant:

DLL_EXPORT int test_ipcmsg_resultsummary(ITesting *t) {
    gnilk::IPCResultSummary resultSummaryOut;
    resultSummaryOut.testsExecuted = 1;
    resultSummaryOut.testsFailed = 2;
    resultSummaryOut.durationSec = 3.0;

    UTest_IPC_VectorWriter vectorWriter;
    gnilk::IPCBufferedWriter bufferedWriter(vectorWriter);
    gnilk::IPCBinaryEncoder encoder(bufferedWriter);

    // Serialize
    TR_ASSERT(t, resultSummaryOut.Marshal(encoder));

    // Flush data - this will do the actual writing to the underlying writer
    bufferedWriter.Flush();
    TR_ASSERT(t, !vectorWriter.Data().empty());

    // Deserialize again
    UTest_IPC_VectorReader vectorReader(vectorWriter.Data());
    gnilk::IPCResultSummary resultSummaryIn;
    gnilk::IPCBinaryDecoder decoder(vectorReader, resultSummaryIn);

    // Deserialize
    TR_ASSERT(t, decoder.Process());
    TR_ASSERT(t, decoder.Available() == false);

    // Make sure we have everything
    TR_ASSERT(t, resultSummaryIn.testsExecuted == resultSummaryOut.testsExecuted);
    TR_ASSERT(t, resultSummaryIn.testsFailed == resultSummaryOut.testsFailed);
    TR_ASSERT(t, resultSummaryIn.durationSec == resultSummaryOut.durationSec);


    return kTR_Pass;
}